

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbo.cpp
# Opt level: O1

void __thiscall vera::Fbo::~Fbo(Fbo *this)

{
  this->_vptr_Fbo = (_func_int **)&PTR__Fbo_003ebfd0;
  unbind(this);
  if (this->m_allocated == true) {
    glDeleteTextures(1,&this->m_id);
    glDeleteRenderbuffers(1,&this->m_depth_buffer);
    glDeleteFramebuffers(1,&this->m_fbo_id);
    this->m_allocated = false;
  }
  return;
}

Assistant:

Fbo::~Fbo() {
    unbind();
    if (m_allocated) {
        glDeleteTextures(1, &m_id);
        glDeleteRenderbuffers(1, &m_depth_buffer);
        glDeleteFramebuffers(1, &m_fbo_id);
        m_allocated = false;
    }
}